

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O2

int __thiscall
JsUtil::
BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
::FindEntryWithKey<IntBoundCheckCompatibilityId>
          (BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
           *this,IntBoundCheckCompatibilityId *key)

{
  Type piVar1;
  Type pSVar2;
  bool bVar3;
  hash_t hashCode;
  uint uVar4;
  ValueNumber VVar5;
  Type this_00;
  IntBoundCheck *pIVar6;
  IntBoundCheckCompatibilityId local_40;
  BaseDictionary<IntBoundCheckCompatibilityId,_IntBoundCheck,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
  *local_38;
  
  piVar1 = this->buckets;
  if (piVar1 == (Type)0x0) {
    uVar4 = 0;
  }
  else {
    hashCode = GetHashCodeWithKey<IntBoundCheckCompatibilityId>(key);
    uVar4 = GetBucket(this,hashCode);
    pSVar2 = this->entries;
    pIVar6 = (IntBoundCheck *)(piVar1 + uVar4);
    uVar4 = 0;
    local_38 = this;
    while( true ) {
      VVar5 = pIVar6->leftValueNumber;
      this = local_38;
      if ((long)(int)VVar5 < 0) break;
      local_40 = IntBoundCheck::CompatibilityId((IntBoundCheck *)(pSVar2 + (int)VVar5));
      bVar3 = IntBoundCheckCompatibilityId::operator==(&local_40,key);
      if (bVar3) {
        this_00 = local_38->stats;
        goto LAB_0047d014;
      }
      uVar4 = uVar4 + 1;
      pIVar6 = (IntBoundCheck *)(pSVar2 + (int)VVar5) + 1;
    }
  }
  this_00 = this->stats;
  VVar5 = 0xffffffff;
LAB_0047d014:
  if (this_00 != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(this_00,uVar4);
  }
  return VVar5;
}

Assistant:

inline int FindEntryWithKey(const LookupType& key) const
        {
#if PROFILE_DICTIONARY
            uint depth = 0;
#endif
            int * localBuckets = buckets;
            if (localBuckets != nullptr)
            {
                hash_t hashCode = GetHashCodeWithKey<LookupType>(key);
                uint targetBucket = this->GetBucket(hashCode);
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        return i;
                    }

#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }
            }

#if PROFILE_DICTIONARY
            if (stats)
                stats->Lookup(depth);
#endif
            return -1;
        }